

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

void __thiscall AmpIO::~AmpIO(AmpIO *this)

{
  BasePort *pBVar1;
  uint uVar2;
  ostream *poVar3;
  PortType portType;
  string local_30;
  
  (this->super_FpgaIO).super_BoardIO._vptr_BoardIO = (_func_int **)&PTR_InitBoard_0011f650;
  if ((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Warning: AmpIO being destroyed while still in use by ");
    uVar2 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0xf])();
    BasePort::PortTypeString_abi_cxx11_(&local_30,(BasePort *)(ulong)uVar2,portType);
    poVar3 = std::operator<<(poVar3,(string *)&local_30);
    poVar3 = std::operator<<(poVar3," Port");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_30);
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0xe])(pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId);
  }
  FpgaIO::~FpgaIO(&this->super_FpgaIO);
  return;
}

Assistant:

AmpIO::~AmpIO()
{
    if (port) {
        std::cerr << "Warning: AmpIO being destroyed while still in use by "
                  << BasePort::PortTypeString(port->GetPortType()) <<" Port" << std::endl;
        port->RemoveBoard(this);
    }
}